

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [36];
  int local_1a4;
  undefined1 local_1a0 [4];
  int i;
  DepthImage im_2;
  DepthImage im_1;
  allocator local_111;
  int n_frames;
  string pat_out;
  allocator local_e9;
  string local_e8 [8];
  string pat_d2;
  allocator local_c1;
  string local_c0 [8];
  string pat_c2;
  allocator local_99;
  string local_98 [8];
  string pat_d1;
  allocator local_71;
  string local_70 [8];
  string pat_c1;
  allocator local_39;
  string local_38 [8];
  string n_frames_str;
  char **argv_local;
  int argc_local;
  
  printf("\n=============================\n");
  printf("Randy depth composer utility");
  printf("\n=============================\n");
  if (argc == 7) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar1,&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    pcVar1 = argv[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    pcVar1 = argv[4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    pcVar1 = argv[5];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    pcVar1 = argv[6];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&n_frames,pcVar1,&local_111);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
    DepthImage::DepthImage((DepthImage *)&im_2.depth.m_Size);
    DepthImage::DepthImage((DepthImage *)local_1a0);
    for (local_1a4 = 0; local_1a4 < iVar2; local_1a4 = local_1a4 + 1) {
      PatternToName(local_1c8,(int)local_70);
      PatternToName(local_1e8,(int)local_98);
      DepthImage::EmplaceData((DepthImage *)&im_2.depth.m_Size,local_1c8,local_1e8);
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1c8);
      PatternToName(local_208,(int)local_c0);
      PatternToName(local_228,(int)local_e8);
      DepthImage::EmplaceData((DepthImage *)local_1a0,local_208,local_228);
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::string::~string((string *)local_208);
      DepthImage::PrintInfo((DepthImage *)&im_2.depth.m_Size);
      DepthImage::PrintInfo((DepthImage *)local_1a0);
      DepthImage::operator+=((DepthImage *)&im_2.depth.m_Size,(DepthImage *)local_1a0);
      PatternToName(local_248,(int)&n_frames);
      DepthImage::SaveToPNG((DepthImage *)&im_2.depth.m_Size,local_248);
      std::__cxx11::string::~string((string *)local_248);
    }
    argv_local._4_4_ = 0;
    DepthImage::~DepthImage((DepthImage *)local_1a0);
    DepthImage::~DepthImage((DepthImage *)&im_2.depth.m_Size);
    std::__cxx11::string::~string((string *)&n_frames);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
  }
  else {
    PrintUsage();
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {

    printf("\n=============================\n");
    printf("Randy depth composer utility");
    printf("\n=============================\n");

    /*Test();
    return 0;*/

    // omp_set_num_threads(2);

    if (argc != 7) {
        PrintUsage();
        return -1;
    }

    // Patse args
    std::string n_frames_str(argv[1]);
    std::string pat_c1(argv[2]);
    std::string pat_d1(argv[3]);
    std::string pat_c2(argv[4]);
    std::string pat_d2(argv[5]);
    std::string pat_out(argv[6]);
    int n_frames = 0;

    try {
        n_frames = std::stoi(n_frames_str);
    } catch (...) {
        printf("Can't parse %s as a number\n", n_frames_str.c_str());
        PrintUsage();
        return -1;
    }

    // Process textures, each thread gets an image and
    // reuses it over and over to avoid reallocations
    DepthImage im_1, im_2;

// #pragma omp parallel for private(im_1, im_2)
    for (int i = 0; i < n_frames; ++i) {

        // auto tid = omp_get_thread_num();
        // parallel_printf("\nThread #%d for task #%d \n\n", tid, i);

        // Image 1
        im_1.EmplaceData(PatternToName(pat_c1, i), PatternToName(pat_d1, i));

        // Image 2
        im_2.EmplaceData(PatternToName(pat_c2, i), PatternToName(pat_d2, i));

        // Print
        im_1.PrintInfo();
        im_2.PrintInfo();

        // Compose
        im_1 += im_2;


        // Save
        im_1.SaveToPNG(PatternToName(pat_out, i));
    }

    return 0;
}